

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Iterator<std::allocator<absl::lts_20240722::status_internal::Payload>_> __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
::Erase(Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
        *this,ConstIterator<std::allocator<absl::lts_20240722::status_internal::Payload>_> from,
       ConstIterator<std::allocator<absl::lts_20240722::status_internal::Payload>_> to)

{
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> destroy_size;
  difference_type dVar1;
  allocator<absl::lts_20240722::status_internal::Payload> *allocator;
  move_iterator<absl::lts_20240722::status_internal::Payload_*> local_60;
  IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_std::move_iterator<absl::lts_20240722::status_internal::Payload_*>_>
  local_58;
  IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_std::move_iterator<absl::lts_20240722::status_internal::Payload_*>_>
  move_values;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> erase_end_index;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> erase_index;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> erase_size;
  StorageView<std::allocator<absl::lts_20240722::status_internal::Payload>_> storage_view;
  ConstIterator<std::allocator<absl::lts_20240722::status_internal::Payload>_> to_local;
  ConstIterator<std::allocator<absl::lts_20240722::status_internal::Payload>_> from_local;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *this_local;
  
  storage_view.capacity =
       (SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_>)to;
  MakeStorageView((StorageView<std::allocator<absl::lts_20240722::status_internal::Payload>_> *)
                  &erase_size,this);
  destroy_size = std::distance<absl::lts_20240722::status_internal::Payload_const*>
                           (from,(Payload *)storage_view.capacity);
  dVar1 = std::distance<absl::lts_20240722::status_internal::Payload_const*>
                    ((Payload *)erase_size,from);
  move_values.it_._M_current =
       (move_iterator<absl::lts_20240722::status_internal::Payload_*>)(dVar1 + destroy_size);
  std::move_iterator<absl::lts_20240722::status_internal::Payload_*>::move_iterator
            (&local_60,(iterator_type)(erase_size + (long)move_values.it_._M_current * 0x30));
  IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_std::move_iterator<absl::lts_20240722::status_internal::Payload_*>_>
  ::IteratorValueAdapter(&local_58,&local_60);
  AssignElements<std::allocator<absl::lts_20240722::status_internal::Payload>,absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,std::move_iterator<absl::lts_20240722::status_internal::Payload*>>>
            ((Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
             (erase_size + dVar1 * 0x30),&local_58,
             (long)storage_view.data - (long)move_values.it_._M_current);
  allocator = GetAllocator(this);
  DestroyAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_false>::
  DestroyElements(allocator,
                  (Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
                  (erase_size + ((long)storage_view.data - destroy_size) * 0x30),destroy_size);
  SubtractSize(this,destroy_size);
  return (Iterator<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
         (erase_size + dVar1 * 0x30);
}

Assistant:

auto Storage<T, N, A>::Erase(ConstIterator<A> from,
                             ConstIterator<A> to) -> Iterator<A> {
  StorageView<A> storage_view = MakeStorageView();

  auto erase_size = static_cast<SizeType<A>>(std::distance(from, to));
  auto erase_index = static_cast<SizeType<A>>(
      std::distance(ConstIterator<A>(storage_view.data), from));
  SizeType<A> erase_end_index = erase_index + erase_size;

  // Fast path: if the value type is trivially relocatable and we know
  // the allocator doesn't do anything fancy, then we know it is legal for us to
  // simply destroy the elements in the "erasure window" (which cannot throw)
  // and then memcpy downward to close the window.
  if (absl::is_trivially_relocatable<ValueType<A>>::value &&
      std::is_nothrow_destructible<ValueType<A>>::value &&
      std::is_same<A, std::allocator<ValueType<A>>>::value) {
    DestroyAdapter<A>::DestroyElements(
        GetAllocator(), storage_view.data + erase_index, erase_size);
    std::memmove(
        reinterpret_cast<char*>(storage_view.data + erase_index),
        reinterpret_cast<const char*>(storage_view.data + erase_end_index),
        (storage_view.size - erase_end_index) * sizeof(ValueType<A>));
  } else {
    IteratorValueAdapter<A, MoveIterator<A>> move_values(
        MoveIterator<A>(storage_view.data + erase_end_index));

    AssignElements<A>(storage_view.data + erase_index, move_values,
                      storage_view.size - erase_end_index);

    DestroyAdapter<A>::DestroyElements(
        GetAllocator(), storage_view.data + (storage_view.size - erase_size),
        erase_size);
  }
  SubtractSize(erase_size);
  return Iterator<A>(storage_view.data + erase_index);
}